

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O1

void ncnn::conv3x3s1_winograd23_transform_kernel_pack8_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  void *pvVar11;
  size_t sVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int *piVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  long lVar20;
  long lVar21;
  _func_int ***ppp_Var22;
  int iVar23;
  long lVar24;
  undefined8 *puVar25;
  ulong uVar26;
  _func_int ***ppp_Var27;
  int iVar28;
  Allocator *pAVar29;
  ulong uVar30;
  _func_int ***ppp_Var31;
  Allocator *pAVar32;
  long lVar33;
  int i;
  long lVar34;
  _func_int ***ppp_Var35;
  Allocator *pAVar36;
  int j;
  long lVar37;
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  float tmp [4] [3];
  Mat local_b8;
  long local_70;
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  
  local_b8.cstep = 0;
  local_b8.data = (Allocator *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elempack = 0;
  local_b8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_b8.elemsize._4_4_ = (int)local_b8.refcount;
  local_b8.allocator = (Allocator *)local_b8.data;
  local_b8.dims = (int)local_b8.refcount;
  local_b8.w = local_b8.refcount._4_4_;
  local_b8.c = local_b8.elempack;
  Mat::create(&local_b8,0x10,inch,outch,4,(Allocator *)0x0);
  auVar19 = _DAT_0054fe80;
  auVar18 = _DAT_0054e600;
  if (0 < outch) {
    pvVar11 = kernel->data;
    uVar30 = 0;
    pAVar36 = (Allocator *)local_b8.data;
    do {
      if (0 < inch) {
        iVar28 = inch * 9 * (int)uVar30;
        uVar26 = 0;
        pAVar29 = pAVar36;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar26 * 0x24 + (long)iVar28 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar26 * 0x24 + (long)iVar28 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar26 * 0x24 + (long)iVar28 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar26 * 0x24 + (long)iVar28 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar26 * 0x24 + (long)iVar28 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar26 * 0x24 + (long)iVar28 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar26 * 0x24 + (long)iVar28 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar26 * 0x24 + (long)iVar28 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar26 * 0x24 + (long)iVar28 * 4 + 0x20);
          fVar13 = auVar18._0_4_;
          fVar14 = auVar18._4_4_;
          fVar15 = auVar18._8_4_;
          fVar16 = auVar18._12_4_;
          auVar39._0_4_ = fVar2 * 0.0 + fVar1 * fVar13 + fVar3 * 0.0;
          auVar39._4_4_ = fVar2 * 0.5 + fVar1 * fVar14 + fVar3 * 0.5;
          auVar39._8_4_ = fVar2 * -0.5 + fVar1 * fVar15 + fVar3 * 0.5;
          auVar39._12_4_ = fVar2 * 0.0 + fVar1 * fVar16 + fVar3 * 1.0;
          auVar40._0_4_ = fVar5 * 0.0 + fVar4 * fVar13 + fVar6 * 0.0;
          auVar40._4_4_ = fVar5 * 0.5 + fVar4 * fVar14 + fVar6 * 0.5;
          auVar40._8_4_ = fVar5 * -0.5 + fVar4 * fVar15 + fVar6 * 0.5;
          auVar40._12_4_ = fVar5 * 0.0 + fVar4 * fVar16 + fVar6 * 1.0;
          auVar41._0_8_ =
               CONCAT44(fVar8 * 0.5 + fVar7 * fVar14 + fVar9 * 0.5,
                        fVar8 * 0.0 + fVar7 * fVar13 + fVar9 * 0.0);
          auVar41._8_4_ = fVar8 * -0.5 + fVar7 * fVar15 + fVar9 * 0.5;
          auVar41._12_4_ = fVar8 * 0.0 + fVar7 * fVar16 + fVar9 * 1.0;
          auVar43._16_16_ = auVar40;
          auVar43._0_16_ = auVar39;
          auVar45 = vpermilps_avx(auVar43,auVar19);
          auVar44._16_16_ = auVar39;
          auVar44._0_16_ = auVar40;
          auVar43 = vmovsldup_avx(auVar44);
          auVar43 = vblendps_avx(auVar45,auVar43,0x42);
          auVar45._8_8_ = auVar41._0_8_;
          auVar45._0_8_ = auVar41._0_8_;
          auVar45._16_16_ = auVar41;
          local_68 = vblendps_avx(auVar43,auVar45,0x24);
          auVar40 = vshufps_avx(auVar39,auVar40,0xff);
          auVar39 = vshufpd_avx(auVar41,auVar41,3);
          local_48 = vblendps_avx(auVar39,auVar40,6);
          lVar37 = 0;
          pAVar32 = pAVar29;
          do {
            fVar1 = *(float *)(local_68 + lVar37 * 0xc);
            uVar10 = *(undefined8 *)(local_68 + lVar37 * 0xc + 4);
            puVar25 = &DAT_005500b4;
            lVar34 = 0;
            do {
              auVar42._0_4_ = (float)*puVar25 * (float)uVar10;
              auVar42._4_4_ = (float)((ulong)*puVar25 >> 0x20) * (float)((ulong)uVar10 >> 0x20);
              auVar42._8_8_ = 0;
              auVar39 = vmovshdup_avx(auVar42);
              *(float *)((long)&pAVar32->_vptr_Allocator + lVar34 * 4) =
                   auVar42._0_4_ + fVar1 * *(float *)((long)puVar25 + -4) + auVar39._0_4_;
              lVar34 = lVar34 + 1;
              puVar25 = (undefined8 *)((long)puVar25 + 0xc);
            } while (lVar34 != 4);
            lVar37 = lVar37 + 1;
            pAVar32 = pAVar32 + 2;
          } while (lVar37 != 4);
          uVar26 = uVar26 + 1;
          pAVar29 = (Allocator *)
                    ((long)&pAVar29->_vptr_Allocator +
                    (long)local_b8.w *
                    CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
        } while (uVar26 != (uint)inch);
      }
      uVar30 = uVar30 + 1;
      pAVar36 = (Allocator *)
                ((long)&pAVar36->_vptr_Allocator +
                local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
    } while (uVar30 != (uint)outch);
  }
  iVar28 = inch + 7;
  if (-1 < inch) {
    iVar28 = inch;
  }
  iVar23 = outch + 7;
  if (-1 < outch) {
    iVar23 = outch;
  }
  Mat::create(kernel_tm_pack8,iVar28 >> 3,0x10,iVar23 >> 3,0x100,0x40,(Allocator *)0x0);
  if (7 < outch) {
    iVar28 = kernel_tm_pack8->w;
    pvVar11 = kernel_tm_pack8->data;
    sVar12 = kernel_tm_pack8->elemsize;
    local_70 = kernel_tm_pack8->cstep * sVar12;
    uVar30 = 0;
    do {
      lVar34 = local_b8.cstep * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      lVar37 = (long)local_b8.w * CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
      ppp_Var35 = (_func_int ***)((long)(_func_int ***)local_b8.data + lVar34 * uVar30);
      lVar38 = 0;
      do {
        if (7 < inch) {
          lVar20 = (long)pvVar11 + (long)iVar28 * sVar12 * lVar38 + (uVar30 >> 3) * local_70;
          ppp_Var31 = ppp_Var35;
          lVar33 = 0;
          do {
            lVar24 = 0;
            ppp_Var27 = ppp_Var31;
            do {
              lVar21 = lVar20;
              lVar20 = 0;
              ppp_Var22 = ppp_Var27;
              do {
                *(undefined4 *)(lVar21 + lVar20) = *(undefined4 *)ppp_Var22;
                ppp_Var22 = (_func_int ***)((long)ppp_Var22 + lVar34);
                lVar20 = lVar20 + 4;
              } while (lVar20 != 0x20);
              lVar24 = lVar24 + 1;
              ppp_Var27 = (_func_int ***)((long)ppp_Var27 + lVar37);
              lVar20 = lVar21 + 0x20;
            } while (lVar24 != 8);
            lVar24 = lVar33 + 0xf;
            ppp_Var31 = ppp_Var31 + lVar37;
            lVar20 = lVar21 + 0x20;
            lVar33 = lVar33 + 8;
          } while (lVar24 < inch);
        }
        lVar38 = lVar38 + 1;
        ppp_Var35 = (_func_int ***)((long)ppp_Var35 + 4);
      } while (lVar38 != 0x10);
      uVar26 = uVar30 + 0xf;
      uVar30 = uVar30 + 8;
    } while (uVar26 < (uint)outch);
  }
  piVar17 = (int *)CONCAT44(local_b8.refcount._4_4_,(int)local_b8.refcount);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_b8.data != (Allocator *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_pack8_avx(const Mat& kernel, Mat& kernel_tm_pack8, int inch, int outch, const Option& opt)
{
    // winograd23 transform kernel
    Mat kernel_tm(4 * 4, inch, outch);

    const float ktm[4][3] = {
        {1.0f, 0.0f, 0.0f},
        {1.0f / 2, 1.0f / 2, 1.0f / 2},
        {1.0f / 2, -1.0f / 2, 1.0f / 2},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 16-inch-outch
    // dst = pb-pa-inch/pa-16-outch/pb
    kernel_tm_pack8.create(inch / 8, 16, outch / 8, (size_t)4u * 8 * 8, 8 * 8);
    for (int q = 0; q + 7 < outch; q += 8)
    {
        Mat g0 = kernel_tm_pack8.channel(q / 8);

        for (int k = 0; k < 16; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 7 < inch; p += 8)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}